

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_c.cpp
# Opt level: O1

void * cpputest_malloc_location(size_t size,char *file,size_t line)

{
  void *pvVar1;
  
  if ((0 < malloc_out_of_memory_counter) &&
     (malloc_out_of_memory_counter = malloc_out_of_memory_counter + -1,
     malloc_out_of_memory_counter == 0)) {
    cpputest_malloc_set_out_of_memory();
  }
  malloc_count = malloc_count + 1;
  pvVar1 = cpputest_malloc_location_with_leak_detection(size,file,line);
  return pvVar1;
}

Assistant:

void* cpputest_malloc_location(size_t size, const char* file, size_t line)
{
    countdown();
    malloc_count++;
    return cpputest_malloc_location_with_leak_detection(size, file, line);
}